

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scan.h
# Opt level: O1

int32_t __thiscall
charls::
jls_codec<charls::default_traits<unsigned_char,_charls::quad<unsigned_char>_>,_charls::decoder_strategy>
::do_run_mode(jls_codec<charls::default_traits<unsigned_char,_charls::quad<unsigned_char>_>,_charls::decoder_strategy>
              *this,int32_t start_index,decoder_strategy *param_2)

{
  pixel_type ra;
  int32_t iVar1;
  quad<unsigned_char> qVar2;
  int iVar3;
  uint uVar4;
  
  ra = (this->current_line_ + start_index)[-1];
  iVar1 = decode_run_pixels(this,ra,this->current_line_ + start_index,this->width_ - start_index);
  uVar4 = start_index + iVar1;
  if (uVar4 != this->width_) {
    qVar2 = decode_run_interruption_pixel(this,ra,this->previous_line_[uVar4]);
    this->current_line_[uVar4] = qVar2;
    iVar3 = 1;
    if (1 < this->run_index_) {
      iVar3 = this->run_index_;
    }
    this->run_index_ = iVar3 + -1;
    iVar1 = iVar1 + 1;
  }
  return iVar1;
}

Assistant:

int32_t do_run_mode(const int32_t start_index, decoder_strategy* /*template_selector*/)
    {
        const pixel_type ra{current_line_[start_index - 1]};

        const int32_t run_length{decode_run_pixels(ra, current_line_ + start_index, width_ - start_index)};
        const uint32_t end_index{static_cast<uint32_t>(start_index + run_length)};

        if (end_index == width_)
            return end_index - start_index;

        // run interruption
        const pixel_type rb{previous_line_[end_index]};
        current_line_[end_index] = decode_run_interruption_pixel(ra, rb);
        decrement_run_index();
        return end_index - start_index + 1;
    }